

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

uint32_t FAudioSourceVoice_SubmitSourceBuffer
                   (FAudioSourceVoice *voice,FAudioBuffer *pBuffer,FAudioBufferWMA *pBufferWMA)

{
  uint uVar1;
  ushort uVar2;
  FAudioBufferEntry *pFVar3;
  FAudioBufferEntry *pFVar4;
  FAudioBufferEntry *pFVar5;
  uint16_t uVar6;
  uint uVar7;
  FAudioWaveFormatEx *pFVar8;
  uint uVar9;
  uint uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  bool bVar13;
  
  uVar9 = pBuffer->PlayBegin;
  uVar7 = pBuffer->PlayLength;
  uVar10 = pBuffer->LoopBegin;
  uVar11 = pBuffer->LoopLength;
  if ((pBuffer->LoopCount == 0) && (uVar10 != 0 || uVar11 != 0)) {
    return 0x88960001;
  }
  if (uVar7 == 0) {
    pFVar8 = (voice->field_19).src.format;
    uVar6 = pFVar8->wFormatTag;
    if (uVar6 == 0x166) {
      uVar7 = *(uint *)((long)&pFVar8[1].nSamplesPerSec + 2);
LAB_00114515:
      uVar7 = uVar7 - uVar9;
      goto LAB_00114518;
    }
    if (uVar6 == 2) {
      uVar7 = (uint)pFVar8[1].wFormatTag * (pBuffer->AudioBytes / (uint)pFVar8->nBlockAlign);
      goto LAB_00114515;
    }
    if (pBufferWMA == (FAudioBufferWMA *)0x0) {
      uVar7 = pBuffer->AudioBytes / (uint)pFVar8->nBlockAlign;
      goto LAB_00114515;
    }
    bVar13 = false;
    uVar7 = pBufferWMA->pDecodedPacketCumulativeBytes[pBufferWMA->PacketCount - 1] /
            ((uint)pFVar8->wBitsPerSample * (uint)pFVar8->nChannels >> 3) - uVar9;
LAB_00114555:
    if (uVar6 == 2) {
      uVar2 = pFVar8[1].wFormatTag;
      uVar9 = uVar9 - uVar9 % (uint)uVar2;
      uVar7 = uVar7 - uVar7 % (uint)uVar2;
      uVar10 = uVar10 - uVar10 % (uint)uVar2;
      uVar11 = uVar11 - uVar11 % (uint)uVar2;
      pBuffer->AudioBytes = pBuffer->AudioBytes - pBuffer->AudioBytes % (uint)pFVar8->nBlockAlign;
      goto LAB_001145d2;
    }
  }
  else {
LAB_00114518:
    bVar13 = pBufferWMA == (FAudioBufferWMA *)0x0;
    pFVar8 = (voice->field_19).src.format;
    uVar6 = pFVar8->wFormatTag;
    if (!bVar13 || pBuffer->LoopCount == 0) goto LAB_00114555;
    if (uVar6 != 0x166) {
      uVar1 = uVar9 + uVar7;
      if (uVar1 < uVar10 || uVar1 - uVar10 == 0) {
        return 0x88960001;
      }
      uVar12 = uVar1 - uVar10;
      if (uVar11 != 0) {
        uVar12 = uVar11;
      }
      uVar11 = uVar12;
      bVar13 = true;
      if (7 < voice->audio->version) {
        if (uVar12 + uVar10 <= uVar9) {
          return 0x88960001;
        }
        bVar13 = true;
        if (uVar1 < uVar12 + uVar10) {
          return 0x88960001;
        }
      }
      goto LAB_00114555;
    }
    uVar6 = 0x166;
    bVar13 = true;
  }
  if (uVar6 == 0x166 || pBufferWMA != (FAudioBufferWMA *)0x0) {
    uVar10 = 0;
    uVar11 = uVar9 + uVar7;
  }
LAB_001145d2:
  pFVar4 = (FAudioBufferEntry *)(*voice->audio->pMalloc)(0x40);
  SDL_memcpy(pFVar4,pBuffer,0x2c);
  (pFVar4->buffer).PlayBegin = uVar9;
  (pFVar4->buffer).PlayLength = uVar7;
  (pFVar4->buffer).LoopBegin = uVar10;
  (pFVar4->buffer).LoopLength = uVar11;
  if (!bVar13) {
    SDL_memcpy(&pFVar4->bufferWMA,pBufferWMA,0xc);
  }
  pFVar4->next = (FAudioBufferEntry *)0x0;
  if (((voice->audio->version < 8) && ((pFVar4->buffer).LoopCount != 0)) &&
     ((pFVar4->buffer).LoopLength + (pFVar4->buffer).LoopBegin <= (pFVar4->buffer).PlayBegin)) {
    (pFVar4->buffer).LoopCount = 0;
  }
  FAudio_PlatformLockMutex((voice->field_19).src.bufferLock);
  pFVar3 = (voice->field_19).src.bufferList;
  if (pFVar3 == (FAudioBufferEntry *)0x0) {
    (voice->field_19).src.bufferList = pFVar4;
    (voice->field_19).src.curBufferOffset = (pFVar4->buffer).PlayBegin;
    (voice->field_19).src.newBuffer = '\x01';
  }
  else {
    do {
      pFVar5 = pFVar3;
      pFVar3 = pFVar5->next;
    } while (pFVar3 != (FAudioBufferEntry *)0x0);
    pFVar5->next = pFVar4;
  }
  FAudio_PlatformUnlockMutex((voice->field_19).src.bufferLock);
  return 0;
}

Assistant:

uint32_t FAudioSourceVoice_SubmitSourceBuffer(
	FAudioSourceVoice *voice,
	const FAudioBuffer *pBuffer,
	const FAudioBufferWMA *pBufferWMA
) {
	uint32_t adpcmMask, *adpcmByteCount;
	uint32_t playBegin, playLength, loopBegin, loopLength;
	FAudioBufferEntry *entry, *list;

	LOG_API_ENTER(voice->audio)
	LOG_INFO(
		voice->audio,
		"%p: {Flags: 0x%x, AudioBytes: %u, pAudioData: %p, Play: %u + %u, Loop: %u + %u x %u}",
		(void*) voice,
		pBuffer->Flags,
		pBuffer->AudioBytes,
		(const void*) pBuffer->pAudioData,
		pBuffer->PlayBegin,
		pBuffer->PlayLength,
		pBuffer->LoopBegin,
		pBuffer->LoopLength,
		pBuffer->LoopCount
	)

	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);
#ifdef HAVE_WMADEC
	FAudio_assert(	(voice->src.wmadec != NULL && (pBufferWMA != NULL ||
					(voice->src.format->wFormatTag == FAUDIO_FORMAT_XMAUDIO2 ||
					 voice->src.format->wFormatTag == FAUDIO_FORMAT_EXTENSIBLE))) ||
			(voice->src.wmadec == NULL && (pBufferWMA == NULL && voice->src.format->wFormatTag != FAUDIO_FORMAT_XMAUDIO2))	);
#endif /* HAVE_WMADEC */

	/* Start off with whatever they just sent us... */
	playBegin = pBuffer->PlayBegin;
	playLength = pBuffer->PlayLength;
	loopBegin = pBuffer->LoopBegin;
	loopLength = pBuffer->LoopLength;

	/* "LoopBegin/LoopLength must be zero if LoopCount is 0" */
	if (pBuffer->LoopCount == 0 && (loopBegin > 0 || loopLength > 0))
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	/* PlayLength Default */
	if (playLength == 0)
	{
		if (voice->src.format->wFormatTag == FAUDIO_FORMAT_MSADPCM)
		{
			FAudioADPCMWaveFormat *fmtex = (FAudioADPCMWaveFormat*) voice->src.format;
			playLength = (
				pBuffer->AudioBytes /
				fmtex->wfx.nBlockAlign *
				fmtex->wSamplesPerBlock
			) - playBegin;
		}
		else if (voice->src.format->wFormatTag == FAUDIO_FORMAT_XMAUDIO2)
		{
			FAudioXMA2WaveFormat *fmtex = (FAudioXMA2WaveFormat*) voice->src.format;
			playLength = fmtex->dwSamplesEncoded - playBegin;
		}
		else if (pBufferWMA != NULL)
		{
			playLength = (
				pBufferWMA->pDecodedPacketCumulativeBytes[pBufferWMA->PacketCount - 1] /
				(voice->src.format->nChannels * voice->src.format->wBitsPerSample / 8)
			) - playBegin;
		}
		else
		{
			playLength = (
				pBuffer->AudioBytes /
				voice->src.format->nBlockAlign
			) - playBegin;
		}
	}

	if (pBuffer->LoopCount > 0 && pBufferWMA == NULL && voice->src.format->wFormatTag != FAUDIO_FORMAT_XMAUDIO2)
	{
		/* "The value of LoopBegin must be less than PlayBegin + PlayLength" */
		if (loopBegin >= (playBegin + playLength))
		{
			LOG_API_EXIT(voice->audio)
			return FAUDIO_E_INVALID_CALL;
		}

		/* LoopLength Default */
		if (loopLength == 0)
		{
			loopLength = playBegin + playLength - loopBegin;
		}

		/* "The value of LoopBegin + LoopLength must be greater than PlayBegin
		 * and less than PlayBegin + PlayLength"
		 */
		if (	voice->audio->version > 7 && (
			(loopBegin + loopLength) <= playBegin ||
			(loopBegin + loopLength) > (playBegin + playLength))	)
		{
			LOG_API_EXIT(voice->audio)
			return FAUDIO_E_INVALID_CALL;
		}
	}

	/* For ADPCM, round down to the nearest sample block size */
	if (voice->src.format->wFormatTag == FAUDIO_FORMAT_MSADPCM)
	{
		adpcmMask = ((FAudioADPCMWaveFormat*) voice->src.format)->wSamplesPerBlock;
		playBegin -= playBegin % adpcmMask;
		playLength -= playLength % adpcmMask;
		loopBegin -= loopBegin % adpcmMask;
		loopLength -= loopLength % adpcmMask;

		/* This is basically a const_cast... */
		adpcmByteCount = (uint32_t*) &pBuffer->AudioBytes;
		*adpcmByteCount = (
			pBuffer->AudioBytes / voice->src.format->nBlockAlign
		) * voice->src.format->nBlockAlign;
	}
	else if (pBufferWMA != NULL || voice->src.format->wFormatTag == FAUDIO_FORMAT_XMAUDIO2)
	{
		/* WMA only supports looping the whole buffer */
		loopBegin = 0;
		loopLength = playBegin + playLength;
	}

	/* Allocate, now that we have valid input */
	entry = (FAudioBufferEntry*) voice->audio->pMalloc(sizeof(FAudioBufferEntry));
	FAudio_memcpy(&entry->buffer, pBuffer, sizeof(FAudioBuffer));
	entry->buffer.PlayBegin = playBegin;
	entry->buffer.PlayLength = playLength;
	entry->buffer.LoopBegin = loopBegin;
	entry->buffer.LoopLength = loopLength;
	if (pBufferWMA != NULL)
	{
		FAudio_memcpy(&entry->bufferWMA, pBufferWMA, sizeof(FAudioBufferWMA));
	}
	entry->next = NULL;

	if (	voice->audio->version <= 7 && (
		entry->buffer.LoopCount > 0 &&
		entry->buffer.LoopBegin + entry->buffer.LoopLength <= entry->buffer.PlayBegin))
	{
		entry->buffer.LoopCount = 0;
	}

#ifdef FAUDIO_DUMP_VOICES
	/* dumping current buffer, append into "data" section */
	if (pBuffer->pAudioData != NULL && playLength > 0)
	{
		FAudio_DUMPVOICE_WriteBuffer(voice, pBuffer, pBufferWMA, playBegin, playLength);
	}
#endif /* FAUDIO_DUMP_VOICES */

	/* Submit! */
	FAudio_PlatformLockMutex(voice->src.bufferLock);
	LOG_MUTEX_LOCK(voice->audio, voice->src.bufferLock)
	if (voice->src.bufferList == NULL)
	{
		voice->src.bufferList = entry;
		voice->src.curBufferOffset = entry->buffer.PlayBegin;
		voice->src.newBuffer = 1;
	}
	else
	{
		list = voice->src.bufferList;
		while (list->next != NULL)
		{
			list = list->next;
		}
		list->next = entry;

		/* For some bizarre reason we get scenarios where a buffer is freed, only to
		 * have the allocator give us the exact same address and somehow get a single
		 * buffer referencing itself. I don't even know.
		 */
		FAudio_assert(list != entry);
	}
	LOG_INFO(
		voice->audio,
		"%p: appended buffer %p",
		(void*) voice,
		(void*) &entry->buffer
	)
	FAudio_PlatformUnlockMutex(voice->src.bufferLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->src.bufferLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}